

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindLess
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<int> *this,int k,bool EQ)

{
  Addr p;
  Addr p_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  IndexNode<int> local_108;
  Addr local_98;
  undefined4 local_90;
  int local_8c;
  int local_88;
  int pos;
  int i;
  IndexNode<int> C;
  bool EQ_local;
  int k_local;
  BpTree<int> *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ret;
  
  C.self.BlockNum._3_1_ = EQ;
  C.self.FileOff = k;
  IndexNode<int>::IndexNode((IndexNode<int> *)&i,this->N);
  pos._3_1_ = 0;
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(__return_storage_ptr__);
  local_8c = 0;
  if ((this->RootAddr).FileOff == -1) {
LAB_00171136:
    pos._3_1_ = 1;
    local_90 = 1;
    IndexNode<int>::~IndexNode((IndexNode<int> *)&i);
    return __return_storage_ptr__;
  }
  local_98 = this->RootAddr;
  FindNode(this,local_98,(IndexNode<int> *)&i);
  while( true ) {
    IndexNode<int>::IndexNode(&local_108,(IndexNode<int> *)&i);
    iVar2 = IsLeaf(this,&local_108);
    IndexNode<int>::~IndexNode(&local_108);
    if (iVar2 != 0) break;
    pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)
                        &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0);
    p.BlockNum = pvVar5->BlockNum;
    p.FileOff = pvVar5->FileOff;
    FindNode(this,p,(IndexNode<int> *)&i);
  }
LAB_00170e7f:
  if ((C.self.BlockNum._3_1_ & 1) == 0) {
    local_88 = local_8c;
    while( true ) {
      bVar1 = false;
      if (local_88 < this->N + -1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)local_88);
        bVar1 = false;
        if (*pvVar3 == '1') {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&C,(long)local_88);
          bVar1 = *pvVar4 < C.self.FileOff;
        }
      }
      if (!bVar1) break;
      pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)local_88);
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert(__return_storage_ptr__,pvVar5);
      local_88 = local_88 + 1;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&C,(long)local_88);
    if (C.self.FileOff <= *pvVar4) goto LAB_00171136;
  }
  else {
    local_88 = local_8c;
    while( true ) {
      bVar1 = false;
      if (local_88 < this->N + -1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)local_88);
        bVar1 = false;
        if (*pvVar3 == '1') {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&C,(long)local_88);
          bVar1 = *pvVar4 <= C.self.FileOff;
        }
      }
      if (!bVar1) break;
      pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)local_88);
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert(__return_storage_ptr__,pvVar5);
      local_88 = local_88 + 1;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&C,(long)local_88);
    if (C.self.FileOff < *pvVar4) goto LAB_00171136;
  }
  if (((local_88 == this->N + -1) ||
      (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)
                           &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_88),
      *pvVar3 == '0')) &&
     (pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)(this->N + -1)), pvVar5->FileOff == -1)) goto LAB_00171136;
  if ((local_88 == this->N + -1) ||
     (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_88), *pvVar3 == '0'
     )) {
    local_8c = 0;
    pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)
                        &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                        (long)(this->N + -1));
    p_00.BlockNum = pvVar5->BlockNum;
    p_00.FileOff = pvVar5->FileOff;
    FindNode(this,p_00,(IndexNode<int> *)&i);
  }
  goto LAB_00170e7f;
}

Assistant:

set<Addr> BpTree<K>::FindLess(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos = 0;
	if (this->RootAddr.FileOff == -1)
		return ret;
	this->FindNode(this->RootAddr, C);
	while (!this->IsLeaf(C)) {
		this->FindNode(C.p[0], C);
	}
	while (1) {
		if (EQ == false) {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] < k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] >= k) {
				break;
			}
		}
		else {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] <= k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] > k) {
				break;
			}
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}